

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_PointsAreCoincident(int dim,bool is_rat,int point_count,int point_stride,double *points)

{
  bool bVar1;
  bool bVar2;
  
  if (((point_count < 2 || points == (double *)0x0) || (point_stride < (int)((uint)is_rat + dim)))
     || (bVar1 = ON_PointsAreCoincident
                           (dim,is_rat,points,points + (point_count + -1) * point_stride), !bVar1))
  {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (2 < point_count) {
      do {
        point_count = point_count + -1;
        bVar1 = point_count == 0;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = ON_PointsAreCoincident(dim,is_rat,points,points + point_stride);
        points = points + point_stride;
      } while (bVar2);
    }
  }
  return bVar1;
}

Assistant:

bool ON_PointsAreCoincident(
    int dim,
    bool is_rat,
    int point_count,
    int point_stride,
    const double* points
    )
{
  if ( 0 == points || point_count < 2 )
    return false;
  if ( point_stride < (is_rat?(dim+1):dim) )
    return false;
  if ( false == ON_PointsAreCoincident( dim, is_rat, points, points + ((point_count-1)*point_stride) ) )
    return false;
  if ( point_count > 2 )
  {
    point_count--;
    while ( point_count-- )
    {
      if ( false == ON_PointsAreCoincident(dim,is_rat,points,points + point_stride ) )
        return false;
      points += point_stride;
    }
  }
  return true;
}